

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_expr.hpp
# Opt level: O2

rt_expr<viennamath::rt_expression_interface<double>_> __thiscall
viennamath::operator*
          (viennamath *this,rt_vector_expr<viennamath::rt_expression_interface<double>_> *lhs,
          rt_vector_expr<viennamath::rt_expression_interface<double>_> *rhs)

{
  ulong uVar1;
  long lVar2;
  type local_70;
  type local_50;
  
  result_of::
  mult<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_false,_false>
  ::instance(&local_70,*(rt_expr<viennamath::rt_expression_interface<double>_> **)(lhs + 8),
             *(rt_expr<viennamath::rt_expression_interface<double>_> **)(rhs + 8));
  rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)this,&local_70);
  rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr(&local_70);
  lVar2 = 8;
  for (uVar1 = 1; uVar1 < (ulong)(*(long *)(rhs + 0x10) - *(long *)(rhs + 8) >> 3);
      uVar1 = uVar1 + 1) {
    result_of::
    mult<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_false,_false>
    ::instance(&local_50,
               (rt_expr<viennamath::rt_expression_interface<double>_> *)(*(long *)(lhs + 8) + lVar2)
               ,(rt_expr<viennamath::rt_expression_interface<double>_> *)
                (*(long *)(rhs + 8) + lVar2));
    result_of::
    add<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>,_false,_false>
    ::instance(&local_70,(rt_expr<viennamath::rt_expression_interface<double>_> *)this,&local_50);
    rt_expr<viennamath::rt_expression_interface<double>_>::operator=
              ((rt_expr<viennamath::rt_expression_interface<double>_> *)this,&local_70);
    rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr(&local_70);
    rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr(&local_50);
    lVar2 = lVar2 + 8;
  }
  return (rt_expr<viennamath::rt_expression_interface<double>_>)
         (auto_ptr<const_viennamath::rt_expression_interface<double>_>)this;
}

Assistant:

rt_expr<InterfaceType> operator*(rt_vector_expr<InterfaceType> const & lhs, rt_vector_expr<InterfaceType> const & rhs)
  {
    assert(lhs.size() == rhs.size() && lhs.size() > 0 && "Invalid or nonmatching size in expression vectors");

    rt_expr<InterfaceType> result = lhs[0] * rhs[0];
    for (std::size_t i=1; i<rhs.size(); ++i)
      result = result + lhs[i] * rhs[i];

    return result;
  }